

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-select.c
# Opt level: O1

ssh_hash * sha1_select(ssh_hashalg *alg)

{
  char cVar1;
  undefined8 *puVar2;
  undefined1 *puVar3;
  undefined1 uVar4;
  ssh_hash *unaff_RBX;
  long lVar5;
  ssh_hashalg *alg_1;
  ssh_hashalg *psVar6;
  bool bVar7;
  
  psVar6 = &ssh_sha1_ni;
  bVar7 = false;
  lVar5 = 0;
  do {
    puVar2 = (undefined8 *)psVar6->extra;
    if (*(char *)puVar2[1] == '\0') {
      uVar4 = (*(code *)*puVar2)();
      puVar3 = (undefined1 *)puVar2[1];
      puVar3[1] = uVar4;
      *puVar3 = 1;
    }
    cVar1 = *(char *)(puVar2[1] + 1);
    if (cVar1 == '\x01') {
      unaff_RBX = (*psVar6->new)(psVar6);
      if (unaff_RBX != (ssh_hash *)0x0) {
        (*unaff_RBX->vt->reset)(unaff_RBX);
      }
    }
    if (cVar1 != '\0') break;
    psVar6 = sha1_select::real_algs[lVar5 + 1];
    lVar5 = lVar5 + 1;
    bVar7 = lVar5 == 2;
  } while (!bVar7);
  if (!bVar7) {
    return unaff_RBX;
  }
  __assert_fail("false && \"sha1_select ran off the end of its list\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha1-select.c"
                ,0x24,"ssh_hash *sha1_select(const ssh_hashalg *)");
}

Assistant:

static ssh_hash *sha1_select(const ssh_hashalg *alg)
{
    static const ssh_hashalg *const real_algs[] = {
#if HAVE_SHA_NI
        &ssh_sha1_ni,
#endif
#if HAVE_NEON_CRYPTO
        &ssh_sha1_neon,
#endif
        &ssh_sha1_sw,
        NULL,
    };

    for (size_t i = 0; real_algs[i]; i++) {
        const ssh_hashalg *alg = real_algs[i];
        const struct sha1_extra *alg_extra =
            (const struct sha1_extra *)alg->extra;
        if (check_availability(alg_extra))
            return ssh_hash_new(alg);
    }

    /* We should never reach the NULL at the end of the list, because
     * the last non-NULL entry should be software-only SHA-1, which
     * is always available. */
    unreachable("sha1_select ran off the end of its list");
}